

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

shared_ptr<Stmt> __thiscall Parser::program(Parser *this)

{
  uint i;
  uint i_00;
  Node *pNVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Stmt> sVar3;
  int after;
  int begin;
  Parser *this_local;
  shared_ptr<Stmt> *s;
  
  block(this);
  pNVar1 = &std::__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this)
            ->super_Node;
  i = Node::newlabel(pNVar1);
  pNVar1 = &std::__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this)
            ->super_Node;
  i_00 = Node::newlabel(pNVar1);
  pNVar1 = &std::__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this)
            ->super_Node;
  Node::emitlabel(pNVar1,i);
  peVar2 = std::__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  (*(peVar2->super_Node)._vptr_Node[2])(peVar2,(ulong)i,(ulong)i_00);
  pNVar1 = &std::__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this)
            ->super_Node;
  Node::emitlabel(pNVar1,i_00);
  sVar3.super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Stmt>)sVar3.super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Stmt> program() {
		// It starts to produce AST
		std::shared_ptr<Stmt> s = block();
	
		// It generates the beginning of the program
		int begin = s->newlabel();
		int after = s->newlabel();
		s->emitlabel(begin);
		s->gen(begin, after);
		s->emitlabel(after);

		return s;
	}